

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptor::GetLocationPath
          (FieldDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  long *plVar1;
  iterator iVar2;
  int local_14;
  
  if (((byte)this[1] & 8) == 0) {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x20),output);
    iVar2._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_0034ef55;
    *iVar2._M_current = 2;
  }
  else if (*(Descriptor **)(this + 0x28) == (Descriptor *)0x0) {
    iVar2._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_0034ef55;
    *iVar2._M_current = 7;
  }
  else {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x28),output);
    iVar2._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
LAB_0034ef55:
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar2,&local_14);
      goto LAB_0034ef62;
    }
    *iVar2._M_current = 6;
  }
  (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = iVar2._M_current + 1;
LAB_0034ef62:
  if (((byte)this[1] & 8) == 0) {
    plVar1 = (long *)(*(long *)(this + 0x20) + 0x28);
  }
  else if (*(long *)(this + 0x28) == 0) {
    plVar1 = (long *)(*(long *)(this + 0x10) + 0x70);
  }
  else {
    plVar1 = (long *)(*(long *)(this + 0x28) + 0x50);
  }
  iVar2._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = (int)((ulong)((long)this - *plVar1) >> 3) * 0x38e38e39;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void FieldDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (is_extension()) {
    if (extension_scope() == nullptr) {
      output->push_back(FileDescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    } else {
      extension_scope()->GetLocationPath(output);
      output->push_back(DescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    }
  } else {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kFieldFieldNumber);
    output->push_back(index());
  }
}